

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_eof(uv_stream_t *stream,uv_buf_t *buf)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  
  pbVar1 = (byte *)((long)&stream->flags + 1);
  *pbVar1 = *pbVar1 | 2;
  uv__io_stop(stream->loop,&stream->io_watcher,1);
  iVar4 = uv__io_active(&stream->io_watcher,4);
  if (((iVar4 == 0) && (uVar3 = stream->flags, (uVar3 >> 0xe & 1) != 0)) &&
     (stream->flags = uVar3 & 0xffffbfff, (uVar3 >> 0xd & 1) != 0)) {
    puVar2 = &stream->loop->active_handles;
    *puVar2 = *puVar2 - 1;
  }
  (*stream->read_cb)(stream,-0xfff,buf);
  *(byte *)&stream->flags = (byte)stream->flags & 0xfb;
  return;
}

Assistant:

static void uv__stream_eof(uv_stream_t* stream, const uv_buf_t* buf) {
  stream->flags |= UV_STREAM_READ_EOF;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  if (!uv__io_active(&stream->io_watcher, POLLOUT))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
  stream->read_cb(stream, UV_EOF, buf);
  stream->flags &= ~UV_STREAM_READING;
}